

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTracer.cpp
# Opt level: O1

vector<float,_std::allocator<float>_> * __thiscall
PathTracer::ExtractColorImage
          (vector<float,_std::allocator<float>_> *__return_storage_ptr__,PathTracer *this,
          shared_ptr<myvk::CommandPool> *command_pool)

{
  enable_shared_from_this<myvk::Base> *peVar1;
  _func_int **pp_Var2;
  int iVar3;
  undefined4 extraout_var;
  pointer pfVar4;
  long lVar5;
  uint uVar6;
  shared_ptr<myvk::Buffer> staging_buffer;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  element_type *local_60;
  shared_ptr<myvk::BufferBase> local_58;
  vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> local_48;
  
  uVar6 = this->m_height * this->m_width;
  iVar3 = (*(((command_pool->super___shared_ptr<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr)->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  local_48.
  super__Vector_base<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  myvk::Buffer::Create
            ((Buffer *)&local_68,(Ptr<Device> *)CONCAT44(extraout_var,iVar3),(ulong)(uVar6 * 4) << 2
             ,0x804,2,VMA_MEMORY_USAGE_AUTO,&local_48);
  std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>::~vector
            (&local_48);
  local_48.
  super__Vector_base<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)(this->m_color_image).super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
  local_48.
  super__Vector_base<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (pointer)(this->m_color_image).super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  if ((element_type *)
      local_48.
      super__Vector_base<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      peVar1 = &(((element_type *)
                 local_48.
                 super__Vector_base<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->super_Base).
                super_enable_shared_from_this<myvk::Base>;
      *(int *)&(peVar1->_M_weak_this).super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr =
           *(int *)&(peVar1->_M_weak_this).super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr + 1;
      UNLOCK();
    }
    else {
      peVar1 = &(((element_type *)
                 local_48.
                 super__Vector_base<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->super_Base).
                super_enable_shared_from_this<myvk::Base>;
      *(int *)&(peVar1->_M_weak_this).super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr =
           *(int *)&(peVar1->_M_weak_this).super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr + 1;
    }
  }
  local_58.super___shared_ptr<myvk::BufferBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_68;
  local_58.super___shared_ptr<myvk::BufferBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60;
  if (local_60 != (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&(local_60->super_enable_shared_from_this<myvk::Base>)._M_weak_this.
               super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(int *)&(local_60->super_enable_shared_from_this<myvk::Base>)._M_weak_this.
                    super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
      UNLOCK();
    }
    else {
      *(int *)&(local_60->super_enable_shared_from_this<myvk::Base>)._M_weak_this.
               super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(int *)&(local_60->super_enable_shared_from_this<myvk::Base>)._M_weak_this.
                    super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
    }
  }
  extract_target_image_to_buffer(command_pool,(shared_ptr<myvk::ImageBase> *)&local_48,&local_58);
  if ((element_type *)
      local_58.super___shared_ptr<myvk::BufferBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.super___shared_ptr<myvk::BufferBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  if ((element_type *)
      local_48.
      super__Vector_base<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_48.
               super__Vector_base<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  pp_Var2 = local_68[4]._vptr__Sp_counted_base;
  std::vector<float,_std::allocator<float>_>::vector
            (__return_storage_ptr__,(ulong)(uVar6 * 3),(allocator_type *)&local_48);
  if (uVar6 != 0) {
    pfVar4 = (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start + 2;
    lVar5 = 0;
    do {
      pfVar4[-2] = *(float *)((long)pp_Var2 + lVar5);
      pfVar4[-1] = *(float *)((long)pp_Var2 + lVar5 + 4);
      *pfVar4 = *(float *)((long)pp_Var2 + lVar5 + 8);
      pfVar4 = pfVar4 + 3;
      lVar5 = lVar5 + 0x10;
    } while ((ulong)uVar6 << 4 != lVar5);
  }
  if (local_60 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<float> PathTracer::ExtractColorImage(const std::shared_ptr<myvk::CommandPool> &command_pool) const {
	const uint32_t kSize = m_width * m_height;
	std::shared_ptr<myvk::Buffer> staging_buffer =
	    myvk::Buffer::Create(command_pool->GetDevicePtr(), kSize * 4 * sizeof(float),
	                         VMA_ALLOCATION_CREATE_MAPPED_BIT | VMA_ALLOCATION_CREATE_HOST_ACCESS_RANDOM_BIT,
	                         VK_BUFFER_USAGE_TRANSFER_DST_BIT);
	extract_target_image_to_buffer(command_pool, m_color_image, staging_buffer);

	auto *data = (float *)staging_buffer->GetMappedData();
	std::vector<float> pixels(kSize * 3);
	for (int i = 0; i < kSize; ++i) {
		pixels[i * 3 + 0] = data[i * 4 + 0];
		pixels[i * 3 + 1] = data[i * 4 + 1];
		pixels[i * 3 + 2] = data[i * 4 + 2];
	}

	return pixels;
}